

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_face_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  REF_NODE pRVar1;
  REF_GEOM pRVar2;
  REF_INT *pRVar3;
  REF_ADJ pRVar4;
  REF_DBL *pRVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  REF_GEOM ref_geom;
  uint uVar9;
  uint uVar10;
  REF_STATUS RVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  ulong uVar14;
  REF_ADJ_ITEM pRVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  undefined8 uVar19;
  REF_INT RVar20;
  int iVar21;
  long lVar22;
  REF_CELL pRVar23;
  char *pcVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  REF_DBL *params;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  REF_INT local;
  uint local_1ac;
  REF_GEOM local_1a8;
  REF_CELL local_1a0;
  REF_DBL ks;
  REF_DBL kr;
  REF_INT local_184;
  REF_GRID local_180;
  REF_DBL gap;
  REF_DICT ref_dict_degen;
  REF_DICT ref_dict_jump;
  REF_DICT ref_dict;
  REF_DBL *local_158;
  REF_INT sens;
  REF_DBL xyz [3];
  long local_110;
  REF_DBL param [2];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  pRVar23 = ref_grid->cell[3];
  pRVar2 = ref_grid->geom;
  uVar9 = ref_dict_create(&ref_dict);
  if (uVar9 == 0) {
    local_1a0 = pRVar23;
    local_180 = ref_grid;
    uVar9 = ref_dict_create(&ref_dict_jump);
    if (uVar9 == 0) {
      uVar9 = ref_dict_create(&ref_dict_degen);
      if (uVar9 == 0) {
        pRVar23 = local_1a0;
        local_1ac = id;
        for (lVar22 = 0; uVar9 = local_1ac, RVar20 = (REF_INT)lVar22, lVar22 < pRVar2->max;
            lVar22 = lVar22 + 1) {
          pRVar3 = pRVar2->descr;
          if ((pRVar3[lVar22 * 6] == 2) && (pRVar3[lVar22 * 6 + 1] == local_1ac)) {
            uVar9 = pRVar3[lVar22 * 6 + 5];
            if (pRVar3[lVar22 * 6 + 4] != 0) {
              RVar20 = -1;
              iVar28 = -1;
              if ((int)uVar9 < 0) goto LAB_0013e332;
              pRVar4 = pRVar23->ref_adj;
              if (pRVar4->nnode <= (int)uVar9) goto LAB_0013e332;
              iVar25 = pRVar4->first[uVar9];
              if (iVar25 == -1) goto LAB_0013e332;
              pRVar15 = pRVar4->item;
              do {
                RVar20 = pRVar15[iVar25].ref;
                iVar28 = iVar25;
LAB_0013e332:
                do {
                  if (iVar28 == -1) goto LAB_0013e324;
                  uVar10 = ref_cell_nodes(pRVar23,RVar20,nodes);
                  if (uVar10 != 0) {
                    uVar16 = (ulong)uVar10;
                    pcVar24 = "nodes";
                    uVar19 = 0xcb7;
                    goto LAB_0013eff1;
                  }
                  if ((nodes[3] == local_1ac) &&
                     (uVar10 = ref_dict_store(ref_dict_degen,RVar20,uVar9), uVar10 != 0)) {
                    uVar16 = (ulong)uVar10;
                    pcVar24 = "mark degen";
                    uVar19 = 0xcb9;
                    goto LAB_0013eff1;
                  }
                  pRVar15 = local_1a0->ref_adj->item;
                  iVar25 = pRVar15[iVar28].next;
                  RVar20 = -1;
                  pRVar23 = local_1a0;
                  iVar28 = iVar25;
                } while (iVar25 == -1);
              } while( true );
            }
            uVar10 = ref_dict_store(ref_dict,uVar9,RVar20);
            if (uVar10 != 0) {
              uVar16 = (ulong)uVar10;
              pcVar24 = "mark nodes";
              uVar19 = 0xcb1;
              goto LAB_0013eff1;
            }
            pRVar23 = local_1a0;
            if ((pRVar2->descr[lVar22 * 6 + 3] != 0) &&
               (uVar9 = ref_dict_store(ref_dict_jump,uVar9,RVar20), pRVar23 = local_1a0, uVar9 != 0)
               ) {
              uVar16 = (ulong)uVar9;
              pcVar24 = "mark jump";
              uVar19 = 0xcb3;
              goto LAB_0013eff1;
            }
          }
LAB_0013e324:
        }
        iVar28 = ref_dict->n;
        lVar22 = (long)iVar28;
        iVar25 = ref_dict_jump->n;
        iVar21 = ref_dict_degen->n;
        uVar10 = 0;
        uVar16 = (ulong)local_1ac;
        local_1a8 = pRVar2;
        local_184 = RVar20;
        for (iVar27 = 0; iVar27 < pRVar23->max; iVar27 = iVar27 + 1) {
          RVar11 = ref_cell_nodes(pRVar23,iVar27,nodes);
          uVar10 = uVar10 + (nodes[3] == uVar9 && RVar11 == 0);
          pRVar23 = local_1a0;
        }
        lVar26 = iVar25 + lVar22;
        iVar25 = (int)lVar26;
        uVar9 = iVar21 + iVar25;
        if ((uVar9 == 0) || (uVar10 == 0)) {
          uVar9 = ref_dict_free(ref_dict_degen);
          if (uVar9 == 0) {
            uVar9 = ref_dict_free(ref_dict_jump);
            if (uVar9 == 0) {
              uVar9 = ref_dict_free(ref_dict);
              if (uVar9 == 0) {
                return 0;
              }
              uVar16 = (ulong)uVar9;
              pcVar24 = "free dict";
              uVar19 = 0xcd0;
            }
            else {
              uVar16 = (ulong)uVar9;
              pcVar24 = "free jump";
              uVar19 = 0xccf;
            }
          }
          else {
            uVar16 = (ulong)uVar9;
            pcVar24 = "free degen";
            uVar19 = 0xcce;
          }
        }
        else {
          fprintf((FILE *)file,
                  "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",uVar16,
                  (ulong)uVar9,(ulong)uVar10,"point","fetriangle");
          if ((int)uVar9 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xcd9,"ref_geom_face_tec_zone","malloc uv of REF_DBL negative");
            return 1;
          }
          uVar9 = uVar9 * 2;
          pRVar12 = (REF_DBL *)malloc((ulong)uVar9 << 3);
          pRVar2 = local_1a8;
          if (pRVar12 == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xcd9,"ref_geom_face_tec_zone","malloc uv of REF_DBL NULL");
            return 2;
          }
          uVar13 = 0;
          uVar14 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar14 = uVar13;
          }
          for (; uVar14 != uVar13; uVar13 = uVar13 + 1) {
            pRVar12[uVar13] = -1.0;
          }
          for (iVar21 = 0; ref_geom = local_1a8, iVar21 < local_1a0->max; iVar21 = iVar21 + 1) {
            RVar11 = ref_cell_nodes(local_1a0,iVar21,nodes);
            if ((RVar11 == 0) && (nodes[3] == local_1ac)) {
              for (lVar29 = 0; lVar29 < local_1a0->node_per; lVar29 = lVar29 + 1) {
                RVar20 = nodes[lVar29];
                uVar9 = ref_geom_find(pRVar2,RVar20,2,local_1ac,&local_184);
                if (uVar9 != 0) {
                  uVar16 = (ulong)uVar9;
                  pcVar24 = "find";
                  uVar19 = 0xcde;
                  goto LAB_0013eff1;
                }
                uVar9 = ref_geom_cell_tuv(pRVar2,RVar20,nodes,2,param,&sens);
                if (uVar9 != 0) {
                  uVar16 = (ulong)uVar9;
                  pcVar24 = "cell tuv";
                  uVar19 = 0xce1;
                  goto LAB_0013eff1;
                }
                if (pRVar2->descr[(long)local_184 * 6 + 4] == 0) {
                  if ((uint)sens < 2) {
                    uVar9 = ref_dict_location(ref_dict,nodes[lVar29],&local);
                    if (uVar9 != 0) {
                      uVar16 = (ulong)uVar9;
                      pcVar24 = "localize";
                      uVar19 = 0xce4;
                      goto LAB_0013eff1;
                    }
                  }
                  else {
                    uVar9 = ref_dict_location(ref_dict_jump,nodes[lVar29],&local);
                    if (uVar9 != 0) {
                      uVar16 = (ulong)uVar9;
                      pcVar24 = "localize";
                      uVar19 = 0xce7;
                      goto LAB_0013eff1;
                    }
                    local = local + iVar28;
                  }
                }
                else {
                  uVar9 = ref_dict_location(ref_dict_degen,iVar21,&local);
                  if (uVar9 != 0) {
                    uVar16 = (ulong)uVar9;
                    pcVar24 = "localize";
                    uVar19 = 0xceb;
                    goto LAB_0013eff1;
                  }
                  local = local + iVar25;
                }
                pRVar12[local * 2] = param[0];
                (pRVar12 + local * 2)[1] = param[1];
              }
            }
            uVar16 = (ulong)local_1ac;
          }
          iVar21 = ref_dict->n;
          iVar27 = -1;
          RVar20 = -1;
          if (0 < iVar21) {
            iVar27 = *ref_dict->key;
            RVar20 = *ref_dict->value;
          }
          params = pRVar12;
          for (lVar29 = 1; lVar29 + -1 < (long)iVar21; lVar29 = lVar29 + 1) {
            kr = 0.0;
            ks = 0.0;
            gap = 0.0;
            pRVar5 = pRVar1->real;
            lVar17 = (long)(iVar27 * 0xf);
            xyz[0] = pRVar5[lVar17];
            xyz[1] = pRVar5[lVar17 + 1];
            xyz[2] = pRVar5[lVar17 + 2];
            if (ref_geom->model != (void *)0x0) {
              local_158 = (REF_DBL *)CONCAT44(local_158._4_4_,iVar27);
              uVar9 = ref_egads_face_curvature(ref_geom,RVar20,&kr,r,&ks,s);
              if (1 < uVar9) {
                uVar16 = (ulong)uVar9;
                pcVar24 = "curve";
                uVar19 = 0xcfd;
                goto LAB_0013eff1;
              }
              uVar9 = ref_egads_eval_at(ref_geom,2,(REF_INT)uVar16,params,xyz,(REF_DBL *)0x0);
              if (uVar9 != 0) {
                uVar16 = (ulong)uVar9;
                pcVar24 = "eval at";
                uVar19 = 0xd00;
                goto LAB_0013eff1;
              }
              uVar9 = ref_egads_gap(ref_geom,(REF_INT)local_158,&gap);
              if (uVar9 != 0) {
                uVar16 = (ulong)uVar9;
                pcVar24 = "gap";
                uVar19 = 0xd01;
                goto LAB_0013eff1;
              }
            }
            if ((ref_geom->meshlink != (void *)0x0) &&
               (uVar9 = ref_meshlink_face_curvature(local_180,RVar20,&kr,r,&ks,s), uVar9 != 0)) {
              uVar16 = (ulong)uVar9;
              pcVar24 = "curve";
              uVar19 = 0xd04;
              goto LAB_0013eff1;
            }
            dVar34 = kr;
            if (kr <= -kr) {
              dVar34 = -kr;
            }
            uVar31 = (undefined4)((ulong)ks >> 0x20);
            if (ks <= -ks) {
              uVar31 = (undefined4)((ulong)-ks >> 0x20);
            }
            uVar30 = SUB84(ks,0);
            dVar6 = dVar34;
            if (dVar34 <= (double)CONCAT44(uVar31,uVar30)) {
              dVar6 = (double)CONCAT44(uVar31,uVar30);
            }
            if ((double)CONCAT44(uVar31,uVar30) <= dVar34) {
              dVar34 = (double)CONCAT44(uVar31,uVar30);
            }
            fprintf((FILE *)file," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %16e\n",SUB84(xyz[0],0)
                    ,xyz[1],xyz[2],gap,*params,params[1],dVar6,dVar34);
            iVar21 = ref_dict->n;
            RVar20 = -1;
            iVar27 = -1;
            if ((int)lVar29 < iVar21) {
              iVar27 = ref_dict->key[lVar29];
              RVar20 = ref_dict->value[lVar29];
            }
            params = params + 2;
          }
          uVar14 = (ulong)(uint)ref_dict_jump->n;
          RVar20 = -1;
          iVar21 = -1;
          if (0 < ref_dict_jump->n) {
            iVar21 = *ref_dict_jump->key;
            RVar20 = *ref_dict_jump->value;
          }
          lVar17 = lVar22 * 2;
          local_180 = (REF_GRID)(pRVar12 + lVar22 * 2);
          local_110 = 0;
          local_158 = pRVar12;
          for (lVar29 = 1; pRVar2 = local_1a8, lVar29 + -1 < (long)(int)uVar14; lVar29 = lVar29 + 1)
          {
            kr = 0.0;
            ks = 0.0;
            gap = 0.0;
            pRVar12 = pRVar1->real;
            lVar18 = (long)(iVar21 * 0xf);
            xyz[0] = pRVar12[lVar18];
            uVar31 = SUB84(xyz[0],0);
            xyz[1] = pRVar12[lVar18 + 1];
            xyz[2] = pRVar12[lVar18 + 2];
            if (local_1a8->model == (void *)0x0) {
              auVar32 = ZEXT816(0);
              lVar18 = lVar17;
            }
            else {
              uVar9 = ref_egads_face_curvature(local_1a8,RVar20,&kr,r,&ks,s);
              if (1 < uVar9) {
                uVar16 = (ulong)uVar9;
                pcVar24 = "curve";
                uVar19 = 0xd15;
                goto LAB_0013eff1;
              }
              uVar9 = ref_egads_eval_at(pRVar2,2,(REF_INT)uVar16,(REF_DBL *)local_180,xyz,
                                        (REF_DBL *)0x0);
              if (uVar9 != 0) {
                uVar16 = (ulong)uVar9;
                pcVar24 = "eval at";
                uVar19 = 0xd18;
                goto LAB_0013eff1;
              }
              uVar9 = ref_egads_gap(pRVar2,iVar21,&gap);
              if (uVar9 != 0) {
                uVar16 = (ulong)uVar9;
                pcVar24 = "gap";
                uVar19 = 0xd19;
                goto LAB_0013eff1;
              }
              uVar31 = SUB84(xyz[0],0);
              auVar32._8_8_ = ks;
              auVar32._0_8_ = kr;
              lVar18 = (local_110 + lVar22) * 2;
            }
            auVar7._8_8_ = auVar32._8_8_ ^ 0x8000000000000000;
            auVar7._0_8_ = auVar32._0_8_ ^ 0x8000000000000000;
            auVar32 = maxpd(auVar32,auVar7);
            dVar34 = auVar32._0_8_;
            if (auVar32._0_8_ <= auVar32._8_8_) {
              dVar34 = auVar32._8_8_;
            }
            fprintf((FILE *)file," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",uVar31,xyz[1],
                    xyz[2],gap,local_158[lVar18],local_158[lVar18 + 1],dVar34,dVar34);
            uVar14 = (ulong)ref_dict_jump->n;
            iVar21 = -1;
            RVar20 = -1;
            if (lVar29 < (long)uVar14) {
              iVar21 = ref_dict_jump->key[lVar29];
              RVar20 = ref_dict_jump->value[lVar29];
            }
            lVar17 = lVar17 + 2;
            local_180 = (REF_GRID)local_180->cell;
            local_110 = local_110 + 1;
          }
          uVar16 = (ulong)(uint)ref_dict_degen->n;
          uVar9 = 0xffffffff;
          if (0 < ref_dict_degen->n) {
            uVar9 = *ref_dict_degen->value;
          }
          lVar22 = 0;
          while (lVar29 = lVar22, lVar29 < (int)uVar16) {
            kr = 0.0;
            ks = 0.0;
            gap = 0.0;
            pRVar12 = pRVar1->real;
            lVar22 = (long)(int)(uVar9 * 0xf);
            xyz[0] = pRVar12[lVar22];
            uVar31 = SUB84(xyz[0],0);
            xyz[1] = pRVar12[lVar22 + 1];
            xyz[2] = pRVar12[lVar22 + 2];
            if (local_1a8->model != (void *)0x0) {
              RVar20 = -1;
              iVar21 = -1;
              local_180 = (REF_GRID)CONCAT44(local_180._4_4_,uVar9);
              if ((int)uVar9 < 0) goto LAB_0013edf8;
              pRVar4 = local_1a8->ref_adj;
              RVar20 = -1;
              if (pRVar4->nnode <= (int)uVar9) goto LAB_0013edf8;
              iVar27 = pRVar4->first[uVar9];
              RVar20 = -1;
              if (iVar27 == -1) goto LAB_0013edf8;
              pRVar15 = pRVar4->item;
              do {
                RVar20 = pRVar15[iVar27].ref;
                iVar21 = iVar27;
LAB_0013edf8:
                do {
                  if (iVar21 == -1) {
                    uVar9 = ref_egads_eval_at(local_1a8,2,local_1ac,
                                              local_158 + (lVar26 + lVar29) * 2,xyz,(REF_DBL *)0x0);
                    if (uVar9 != 0) {
                      uVar16 = (ulong)uVar9;
                      pcVar24 = "eval at";
                      uVar19 = 0xd32;
                      goto LAB_0013eff1;
                    }
                    uVar9 = ref_egads_gap(local_1a8,(REF_INT)local_180,&gap);
                    if (uVar9 != 0) {
                      uVar16 = (ulong)uVar9;
                      pcVar24 = "gap";
                      uVar19 = 0xd33;
                      goto LAB_0013eff1;
                    }
                    uVar31 = SUB84(xyz[0],0);
                    auVar33._8_8_ = ks;
                    auVar33._0_8_ = kr;
                    goto LAB_0013eeef;
                  }
                  if (((pRVar2->descr[RVar20 * 6] == 2) &&
                      (pRVar2->descr[(int)(RVar20 * 6 | 1)] == local_1ac)) &&
                     (uVar9 = ref_egads_face_curvature(pRVar2,RVar20,&kr,r,&ks,s), 1 < uVar9)) {
                    uVar16 = (ulong)uVar9;
                    pcVar24 = "curve";
                    uVar19 = 0xd2d;
                    goto LAB_0013eff1;
                  }
                  pRVar15 = pRVar2->ref_adj->item;
                  iVar27 = pRVar15[iVar21].next;
                  RVar20 = -1;
                  iVar21 = iVar27;
                } while (iVar27 == -1);
              } while( true );
            }
            auVar33 = ZEXT816(0);
LAB_0013eeef:
            auVar8._8_8_ = auVar33._8_8_ ^ 0x8000000000000000;
            auVar8._0_8_ = auVar33._0_8_ ^ 0x8000000000000000;
            auVar32 = maxpd(auVar33,auVar8);
            dVar34 = auVar32._0_8_;
            if (auVar32._0_8_ <= auVar32._8_8_) {
              dVar34 = auVar32._8_8_;
            }
            fprintf((FILE *)file," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",uVar31,xyz[1],
                    xyz[2],gap,local_158[(lVar26 + lVar29) * 2],local_158[(lVar26 + lVar29) * 2 + 1]
                    ,dVar34,dVar34);
            lVar22 = lVar29 + 1;
            uVar16 = (ulong)ref_dict_degen->n;
            uVar9 = 0xffffffff;
            if (lVar22 < (long)uVar16) {
              uVar9 = ref_dict_degen->value[lVar29 + 1];
            }
          }
          local_184 = RVar20;
          free(local_158);
          for (iVar21 = 0; iVar21 < local_1a0->max; iVar21 = iVar21 + 1) {
            RVar11 = ref_cell_nodes(local_1a0,iVar21,nodes);
            if ((RVar11 == 0) && (nodes[3] == local_1ac)) {
              for (lVar22 = 0; lVar22 < local_1a0->node_per; lVar22 = lVar22 + 1) {
                RVar20 = nodes[lVar22];
                uVar9 = ref_geom_find(local_1a8,RVar20,2,local_1ac,&local_184);
                if (uVar9 != 0) {
                  uVar16 = (ulong)uVar9;
                  pcVar24 = "find";
                  uVar19 = 0xd41;
                  goto LAB_0013eff1;
                }
                uVar9 = ref_geom_cell_tuv(local_1a8,RVar20,nodes,2,param,&sens);
                if (uVar9 != 0) {
                  uVar16 = (ulong)uVar9;
                  pcVar24 = "cell tuv";
                  uVar19 = 0xd44;
                  goto LAB_0013eff1;
                }
                if (local_1a8->descr[(long)local_184 * 6 + 4] == 0) {
                  if ((uint)sens < 2) {
                    uVar9 = ref_dict_location(ref_dict,nodes[lVar22],&local);
                    if (uVar9 != 0) {
                      uVar16 = (ulong)uVar9;
                      pcVar24 = "localize";
                      uVar19 = 0xd47;
                      goto LAB_0013eff1;
                    }
                  }
                  else {
                    uVar9 = ref_dict_location(ref_dict_jump,nodes[lVar22],&local);
                    if (uVar9 != 0) {
                      uVar16 = (ulong)uVar9;
                      pcVar24 = "localize";
                      uVar19 = 0xd4a;
                      goto LAB_0013eff1;
                    }
                    local = local + iVar28;
                  }
                }
                else {
                  uVar9 = ref_dict_location(ref_dict_degen,iVar21,&local);
                  if (uVar9 != 0) {
                    uVar16 = (ulong)uVar9;
                    pcVar24 = "localize";
                    uVar19 = 0xd4e;
                    goto LAB_0013eff1;
                  }
                  local = local + iVar25;
                }
                fprintf((FILE *)file," %d",(ulong)(local + 1));
              }
              fputc(10,(FILE *)file);
            }
          }
          uVar9 = ref_dict_free(ref_dict_degen);
          if (uVar9 == 0) {
            uVar9 = ref_dict_free(ref_dict_jump);
            if (uVar9 == 0) {
              uVar9 = ref_dict_free(ref_dict);
              if (uVar9 == 0) {
                return 0;
              }
              uVar16 = (ulong)uVar9;
              pcVar24 = "free dict";
              uVar19 = 0xd59;
            }
            else {
              uVar16 = (ulong)uVar9;
              pcVar24 = "free jump";
              uVar19 = 0xd58;
            }
          }
          else {
            uVar16 = (ulong)uVar9;
            pcVar24 = "free degen";
            uVar19 = 0xd57;
          }
        }
      }
      else {
        uVar16 = (ulong)uVar9;
        pcVar24 = "create dict";
        uVar19 = 0xcab;
      }
    }
    else {
      uVar16 = (ulong)uVar9;
      pcVar24 = "create dict";
      uVar19 = 0xcaa;
    }
LAB_0013eff1:
    uVar9 = (uint)uVar16;
  }
  else {
    uVar16 = (ulong)uVar9;
    pcVar24 = "create dict";
    uVar19 = 0xca9;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar19,
         "ref_geom_face_tec_zone",uVar16,pcVar24);
  return uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_geom_face_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict, ref_dict_jump, ref_dict_degen;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item2, item, local, node;
  REF_INT nnode, nnode_sens0, nnode_degen, ntri;
  REF_INT sens;
  REF_DBL *uv, param[2];
  REF_DBL kr, r[3], ks, s[3], xyz[3], kmin, kmax, gap;

  RSS(ref_dict_create(&ref_dict), "create dict");
  RSS(ref_dict_create(&ref_dict_jump), "create dict");
  RSS(ref_dict_create(&ref_dict_degen), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (id == ref_geom_id(ref_geom, geom)) {
      if (0 == ref_geom_degen(ref_geom, geom)) {
        RSS(ref_dict_store(ref_dict, node, geom), "mark nodes");
        if (0 != ref_geom_jump(ref_geom, geom)) {
          RSS(ref_dict_store(ref_dict_jump, node, geom), "mark jump");
        }
      } else {
        each_ref_cell_having_node(ref_cell, node, item, cell) {
          RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
          if (id == nodes[3]) {
            RSS(ref_dict_store(ref_dict_degen, cell, node), "mark degen");
          }
        }
      }
    }
  }

  nnode_sens0 = ref_dict_n(ref_dict);
  nnode_degen = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump);
  nnode = ref_dict_n(ref_dict) + ref_dict_n(ref_dict_jump) +
          ref_dict_n(ref_dict_degen);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict_degen), "free degen");
    RSS(ref_dict_free(ref_dict_jump), "free jump");
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  ref_malloc_init(uv, 2 * nnode, REF_DBL, -1.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        uv[0 + 2 * local] = param[0];
        uv[1 + 2 * local] = param[1];
      }
    }
  }

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), REF_FAILURE,
          "curve");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id, &(uv[2 * item]), xyz,
                            NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s), "curve");
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MIN(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * item], uv[1 + 2 * item], kmax,
            kmin);
  }
  each_ref_dict_key_value(ref_dict_jump, item, node, geom) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s), REF_FAILURE,
          "curve");
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_sens0 + item)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MAX(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode_sens0 + item)],
            uv[1 + 2 * (nnode_sens0 + item)], kmax, kmin);
  }
  each_ref_dict_key_value(ref_dict_degen, item, cell, node) {
    kr = 0;
    ks = 0;
    gap = 0;
    xyz[0] = ref_node_xyz(ref_node, 0, node);
    xyz[1] = ref_node_xyz(ref_node, 1, node);
    xyz[2] = ref_node_xyz(ref_node, 2, node);
    if (ref_geom_model_loaded(ref_geom)) {
      each_ref_geom_having_node(ref_geom, node, item2, geom) {
        if (ref_geom_type(ref_geom, geom) == REF_GEOM_FACE &&
            ref_geom_id(ref_geom, geom) == id) {
          RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s),
              REF_FAILURE, "curve");
        }
      }
      RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id,
                            &(uv[2 * (nnode_degen + item)]), xyz, NULL),
          "eval at");
      RSS(ref_egads_gap(ref_geom, node, &gap), "gap")
    }
    kmax = MAX(ABS(kr), ABS(ks));
    kmin = MAX(ABS(kr), ABS(ks));
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n", xyz[0],
            xyz[1], xyz[2], gap, uv[0 + 2 * (nnode_degen + item)],
            uv[1 + 2 * (nnode_degen + item)], kmax, kmin);
  }
  ref_free(uv);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      each_ref_cell_cell_node(ref_cell, node) {
        RSS(ref_geom_find(ref_geom, nodes[node], REF_GEOM_FACE, id, &geom),
            "find");
        RSS(ref_geom_cell_tuv(ref_geom, nodes[node], nodes, REF_GEOM_FACE,
                              param, &sens),
            "cell tuv");
        if (0 == ref_geom_degen(ref_geom, geom)) {
          if (0 == sens || 1 == sens) {
            RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
          } else {
            RSS(ref_dict_location(ref_dict_jump, nodes[node], &local),
                "localize");
            local += nnode_sens0;
          }
        } else {
          RSS(ref_dict_location(ref_dict_degen, cell, &local), "localize");
          local += nnode_degen;
        }
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict_degen), "free degen");
  RSS(ref_dict_free(ref_dict_jump), "free jump");
  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}